

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglversionprofile.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QOpenGLVersionProfile *vp)

{
  bool bVar1;
  pair<int,_int> pVar2;
  QDebug *o;
  QOpenGLVersionProfile *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QDebug *in_stack_ffffffffffffff98;
  Stream *this;
  QDebug *in_stack_ffffffffffffffb8;
  OpenGLContextProfile value;
  QDebug local_20;
  QDebug in_stack_ffffffffffffffe8;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  this = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  QDebug::nospace(in_RSI);
  QDebug::operator<<(in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffe8.stream);
  bVar1 = QOpenGLVersionProfile::isValid(in_RDX);
  if (bVar1) {
    pVar2 = QOpenGLVersionProfile::version((QOpenGLVersionProfile *)this);
    value = pVar2.second;
    QDebug::operator<<((QDebug *)this,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    in_stack_ffffffffffffff98 =
         QDebug::operator<<((QDebug *)this,(char)((ulong)in_stack_ffffffffffffff98 >> 0x38));
    pVar2 = QOpenGLVersionProfile::version((QOpenGLVersionProfile *)this);
    QDebug::operator<<((QDebug *)this,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    o = QDebug::operator<<((QDebug *)pVar2,(char *)in_stack_ffffffffffffffe8.stream);
    QDebug::QDebug(&local_20,o);
    QOpenGLVersionProfile::profile(in_RDX);
    operator<<((QDebug *)in_RDX,value);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffe8);
    QDebug::~QDebug(&local_20);
  }
  else {
    QDebug::operator<<(in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffe8.stream);
  }
  QDebug::operator<<((QDebug *)this,(char)((ulong)in_stack_ffffffffffffff98 >> 0x38));
  QDebug::QDebug((QDebug *)this,in_stack_ffffffffffffff98);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QOpenGLVersionProfile &vp)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    debug << "QOpenGLVersionProfile(";
    if (vp.isValid()) {
        debug << vp.version().first << '.' << vp.version().second
            << ", profile=" << vp.profile();
    } else {
        debug << "invalid";
    }
    debug << ')';
    return debug;
}